

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

void __thiscall IR::Instr::GenerateBytecodeArgOutCapture(Instr *this)

{
  Func *func;
  bool bVar1;
  IRType type;
  ArgSlot argSlotNum;
  StackSym *pSVar2;
  Opnd *pOVar3;
  Instr *this_00;
  Instr *instr;
  StackSym *tmpSym;
  Instr *this_local;
  
  bVar1 = HasByteCodeArgOutCapture(this);
  if (!bVar1) {
    pSVar2 = Opnd::GetStackSym(this->m_dst);
    *(uint *)&pSVar2->field_0x18 = *(uint *)&pSVar2->field_0x18 & 0xfdffffff | 0x2000000;
    pOVar3 = GetDst(this);
    pSVar2 = Opnd::GetStackSym(pOVar3);
    argSlotNum = StackSym::GetArgSlotNum(pSVar2);
    func = this->m_func;
    pOVar3 = GetDst(this);
    type = Opnd::GetType(pOVar3);
    pSVar2 = StackSym::NewArgSlotRegSym(argSlotNum,func,type);
    this_00 = HoistSrc1(this,BytecodeArgOutCapture,RegNOREG,pSVar2);
    SetByteCodeOffset(this_00,this);
  }
  return;
}

Assistant:

void Instr::GenerateBytecodeArgOutCapture()
{
    if (!HasByteCodeArgOutCapture())
    {
        this->m_dst->GetStackSym()->m_isArgCaptured = true;
        StackSym* tmpSym = StackSym::NewArgSlotRegSym(this->GetDst()->GetStackSym()->GetArgSlotNum(), this->m_func, this->GetDst()->GetType());
        IR::Instr* instr = this->HoistSrc1(Js::OpCode::BytecodeArgOutCapture, RegNOREG, tmpSym);
        instr->SetByteCodeOffset(this);
    }
}